

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O3

int secp256k1_ecdsa_signature_serialize_compact
              (secp256k1_context *ctx,uchar *output64,secp256k1_ecdsa_signature *sig)

{
  int i;
  long lVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  if (ctx == (secp256k1_context *)0x0) {
    secp256k1_ecdsa_signature_serialize_compact_cold_3();
  }
  else if (output64 != (uchar *)0x0) {
    if (sig == (secp256k1_ecdsa_signature *)0x0) {
      secp256k1_ecdsa_signature_serialize_compact_cold_1();
      return 0;
    }
    lVar1 = 0;
    uVar4 = 0;
    do {
      uVar2 = (uint)sig->data[lVar1] | uVar4 << 8;
      uVar4 = uVar2 - (uVar2 / 0xd + (uVar2 / 0xd) * 0xc);
      if (uVar2 < 0xd) {
        uVar4 = uVar2;
      }
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0x20);
    secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar4);
    lVar1 = 0;
    uVar2 = 0;
    do {
      uVar3 = (uint)sig->data[lVar1 + 0x20] | uVar2 << 8;
      uVar2 = uVar3 - (uVar3 / 0xd + (uVar3 / 0xd) * 0xc);
      if (uVar3 < 0xd) {
        uVar2 = uVar3;
      }
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0x20);
    secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar2);
    secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar4);
    output64[0xc] = '\0';
    output64[0xd] = '\0';
    output64[0xe] = '\0';
    output64[0xf] = '\0';
    output64[0x10] = '\0';
    output64[0x11] = '\0';
    output64[0x12] = '\0';
    output64[0x13] = '\0';
    output64[0x14] = '\0';
    output64[0x15] = '\0';
    output64[0x16] = '\0';
    output64[0x17] = '\0';
    output64[0x18] = '\0';
    output64[0x19] = '\0';
    output64[0x1a] = '\0';
    output64[0x1b] = '\0';
    output64[0] = '\0';
    output64[1] = '\0';
    output64[2] = '\0';
    output64[3] = '\0';
    output64[4] = '\0';
    output64[5] = '\0';
    output64[6] = '\0';
    output64[7] = '\0';
    output64[8] = '\0';
    output64[9] = '\0';
    output64[10] = '\0';
    output64[0xb] = '\0';
    output64[0xc] = '\0';
    output64[0xd] = '\0';
    output64[0xe] = '\0';
    output64[0xf] = '\0';
    *(uint *)(output64 + 0x1c) =
         uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
    secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar2);
    output64[0x2c] = '\0';
    output64[0x2d] = '\0';
    output64[0x2e] = '\0';
    output64[0x2f] = '\0';
    output64[0x30] = '\0';
    output64[0x31] = '\0';
    output64[0x32] = '\0';
    output64[0x33] = '\0';
    output64[0x34] = '\0';
    output64[0x35] = '\0';
    output64[0x36] = '\0';
    output64[0x37] = '\0';
    output64[0x38] = '\0';
    output64[0x39] = '\0';
    output64[0x3a] = '\0';
    output64[0x3b] = '\0';
    output64[0x20] = '\0';
    output64[0x21] = '\0';
    output64[0x22] = '\0';
    output64[0x23] = '\0';
    output64[0x24] = '\0';
    output64[0x25] = '\0';
    output64[0x26] = '\0';
    output64[0x27] = '\0';
    output64[0x28] = '\0';
    output64[0x29] = '\0';
    output64[0x2a] = '\0';
    output64[0x2b] = '\0';
    output64[0x2c] = '\0';
    output64[0x2d] = '\0';
    output64[0x2e] = '\0';
    output64[0x2f] = '\0';
    *(uint *)(output64 + 0x3c) =
         uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    return 1;
  }
  secp256k1_ecdsa_signature_serialize_compact_cold_2();
  return 0;
}

Assistant:

int secp256k1_ecdsa_signature_serialize_compact(const secp256k1_context* ctx, unsigned char *output64, const secp256k1_ecdsa_signature* sig) {
    secp256k1_scalar r, s;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(output64 != NULL);
    ARG_CHECK(sig != NULL);

    secp256k1_ecdsa_signature_load(ctx, &r, &s, sig);
    secp256k1_scalar_get_b32(&output64[0], &r);
    secp256k1_scalar_get_b32(&output64[32], &s);
    return 1;
}